

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O1

int __thiscall MeCab::Mmap<char>::close(Mmap<char> *this,int __fd)

{
  int in_EAX;
  
  if (-1 < this->fd) {
    in_EAX = ::close(this->fd);
    this->fd = -1;
  }
  if (this->text != (char *)0x0) {
    in_EAX = munmap(this->text,this->length);
    this->text = (char *)0x0;
  }
  this->text = (char *)0x0;
  return in_EAX;
}

Assistant:

void close() {
    if (fd >= 0) {
      ::close(fd);
      fd = -1;
    }

    if (text) {
#ifdef HAVE_MMAP
      ::munmap(reinterpret_cast<char *>(text), length);
      text = 0;
#else
      if (flag == O_RDWR) {
        int fd2;
        if ((fd2 = ::open(fileName.c_str(), O_RDWR)) >= 0) {
          ::write(fd2, text, length);
          ::close(fd2);
        }
      }
      delete [] text;
#endif
    }

    text = 0;
  }